

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# properties.cc
# Opt level: O2

void __thiscall gutil::PropertyNode::saveOctave(PropertyNode *this,ostream *out)

{
  string *psVar1;
  size_type sVar2;
  pointer psVar3;
  ostream *poVar4;
  size_t i;
  ulong uVar5;
  int k;
  int iVar6;
  long lVar7;
  Matrixd M;
  DMatrix<double> local_1e0;
  Matrixd tmp;
  char *vp;
  istringstream in;
  
  sVar2 = (this->name)._M_string_length;
  if ((this->list).
      super__Vector_base<std::shared_ptr<gutil::PropertyNode>,_std::allocator<std::shared_ptr<gutil::PropertyNode>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->list).
      super__Vector_base<std::shared_ptr<gutil::PropertyNode>,_std::allocator<std::shared_ptr<gutil::PropertyNode>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    if (sVar2 != 0) {
      poVar4 = std::operator<<(out,"# name: ");
      poVar4 = std::operator<<(poVar4,(string *)this);
      std::endl<char,std::char_traits<char>>(poVar4);
      poVar4 = std::operator<<(out,"# type: scalar struct");
      std::endl<char,std::char_traits<char>>(poVar4);
      poVar4 = std::operator<<(out,"# ndims: 2");
      std::endl<char,std::char_traits<char>>(poVar4);
      poVar4 = std::operator<<(out,"  1 1");
      std::endl<char,std::char_traits<char>>(poVar4);
      poVar4 = std::operator<<(out,"# length: ");
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      std::endl<char,std::char_traits<char>>(poVar4);
    }
    lVar7 = 0;
    for (uVar5 = 0;
        psVar3 = (this->list).
                 super__Vector_base<std::shared_ptr<gutil::PropertyNode>,_std::allocator<std::shared_ptr<gutil::PropertyNode>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
        uVar5 < (ulong)((long)(this->list).
                              super__Vector_base<std::shared_ptr<gutil::PropertyNode>,_std::allocator<std::shared_ptr<gutil::PropertyNode>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)psVar3 >> 4);
        uVar5 = uVar5 + 1) {
      saveOctave(*(PropertyNode **)
                  ((long)&(psVar3->
                          super___shared_ptr<gutil::PropertyNode,_(__gnu_cxx::_Lock_policy)2>).
                          _M_ptr + lVar7),out);
      lVar7 = lVar7 + 0x10;
    }
    std::endl<char,std::char_traits<char>>(out);
    std::endl<char,std::char_traits<char>>(out);
    return;
  }
  if ((sVar2 != 0) && ((this->value)._M_string_length != 0)) {
    psVar1 = &this->value;
    vp = (char *)0x0;
    strtod((psVar1->_M_dataplus)._M_p,&vp);
    if (*vp == '\0') {
      poVar4 = std::operator<<(out,"# name: ");
      poVar4 = std::operator<<(poVar4,(string *)this);
      std::endl<char,std::char_traits<char>>(poVar4);
      poVar4 = std::operator<<(out,"# type: scalar");
      std::endl<char,std::char_traits<char>>(poVar4);
      poVar4 = std::operator<<(out,(string *)psVar1);
      std::endl<char,std::char_traits<char>>(poVar4);
      std::endl<char,std::char_traits<char>>(out);
      std::endl<char,std::char_traits<char>>(out);
    }
    else {
      gmath::DMatrix<double>::DMatrix(&M,0,0);
      std::__cxx11::istringstream::istringstream((istringstream *)&in,(string *)psVar1,_S_in);
      gmath::operator>>((basic_istream<char,_std::char_traits<char>_> *)&in,&M);
      if ((0 < M.nrows) && (0 < M.ncols)) {
        if (M.nrows == 1) {
          gmath::DMatrix<double>::DMatrix(&tmp,&M);
          gmath::transpose<double>(&local_1e0,&tmp);
          gmath::DMatrix<double>::operator=(&M,&local_1e0);
          gmath::DMatrix<double>::~DMatrix(&local_1e0);
          gmath::DMatrix<double>::~DMatrix(&tmp);
        }
        poVar4 = std::operator<<(out,"# name: ");
        poVar4 = std::operator<<(poVar4,(string *)this);
        std::endl<char,std::char_traits<char>>(poVar4);
        poVar4 = std::operator<<(out,"# type: matrix");
        std::endl<char,std::char_traits<char>>(poVar4);
        poVar4 = std::operator<<(out,"# rows: ");
        poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,M.nrows);
        std::endl<char,std::char_traits<char>>(poVar4);
        poVar4 = std::operator<<(out,"# columns: ");
        poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,M.ncols);
        std::endl<char,std::char_traits<char>>(poVar4);
        *(undefined8 *)(out + *(long *)(*(long *)out + -0x18) + 8) = 0x10;
        for (iVar6 = 0; iVar6 < M.nrows; iVar6 = iVar6 + 1) {
          for (lVar7 = 0; (int)lVar7 < M.ncols; lVar7 = lVar7 + 1) {
            std::operator<<(out,' ');
            std::ostream::_M_insert<double>(M.v[(long)M.ncols * (long)iVar6 + lVar7]);
          }
          std::endl<char,std::char_traits<char>>(out);
        }
        std::endl<char,std::char_traits<char>>(out);
        std::endl<char,std::char_traits<char>>(out);
      }
      std::__cxx11::istringstream::~istringstream((istringstream *)&in);
      gmath::DMatrix<double>::~DMatrix(&M);
    }
  }
  return;
}

Assistant:

void saveOctave(std::ostream &out) const
    {
      if (list.size() > 0)
      {
        if (name.size() > 0)
        {
          // add structure element
          out << "# name: " << name << std::endl;
          out << "# type: scalar struct" << std::endl;
          out << "# ndims: 2" << std::endl;
          out << "  1 1" << std::endl;
          out << "# length: " << list.size() << std::endl;
        }

        // store all children
        for (size_t i=0; i<list.size(); i++)
        {
          list[i]->saveOctave(out);
        }

        out << std::endl;
        out << std::endl;
      }
      else if (name.size() > 0 && value.size() > 0)
      {
        char *vp=0;
        std::strtod(value.c_str(), &vp);

        if (*vp == '\0')
        {
          // store scalar
          out << "# name: " << name << std::endl;
          out << "# type: scalar" << std::endl;
          out << value << std::endl;
          out << std::endl;
          out << std::endl;
        }
        else
        {
          try
          {
            gmath::Matrixd M;
            std::istringstream in(value);
            in >> M;

            if (M.rows() > 0 && M.cols() > 0)
            {
              if (M.rows() == 1)
              {
                // store vector always as column
                gmath::Matrixd tmp=M;
                M=gmath::transpose(tmp);
              }

              // store matrix
              out << "# name: " << name << std::endl;
              out << "# type: matrix" << std::endl;
              out << "# rows: " << M.rows() << std::endl;
              out << "# columns: " << M.cols() << std::endl;
              out.precision(16);

              for (int k=0; k<M.rows(); k++)
              {
                for (int i=0; i<M.cols(); i++)
                {
                  out << ' ' << M(k, i);
                }

                out << std::endl;
              }

              out << std::endl;
              out << std::endl;
            }
          }
          catch (...)
          { }
        }
      }
    }